

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O1

void __thiscall
cmOSXBundleGenerator::cmOSXBundleGenerator
          (cmOSXBundleGenerator *this,cmGeneratorTarget *target,string *configName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  cmMakefile *pcVar5;
  cmLocalGenerator *pcVar6;
  
  this->GT = target;
  pcVar5 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar5;
  pcVar6 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar6;
  paVar1 = &(this->ConfigName).field_2;
  (this->ConfigName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (configName->_M_dataplus)._M_p;
  paVar2 = &configName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&configName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ConfigName).field_2 + 8) = uVar4;
  }
  else {
    (this->ConfigName)._M_dataplus._M_p = pcVar3;
    (this->ConfigName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ConfigName)._M_string_length = configName->_M_string_length;
  (configName->_M_dataplus)._M_p = (pointer)paVar2;
  configName->_M_string_length = 0;
  (configName->field_2)._M_local_buf[0] = '\0';
  this->MacContentFolders =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  return;
}

Assistant:

cmOSXBundleGenerator::cmOSXBundleGenerator(cmGeneratorTarget* target,
                                           std::string configName)
  : GT(target)
  , Makefile(target->Target->GetMakefile())
  , LocalGenerator(target->GetLocalGenerator())
  , ConfigName(std::move(configName))
  , MacContentFolders(nullptr)
{
  if (this->MustSkip()) {
    return;
  }
}